

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_g10_currencies_are_valid_Test::TestBody
          (CurrenciesTest_test_g10_currencies_are_valid_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult local_40;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"USD","");
  local_40.success_ =
       (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
  local_40.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  bVar2 = local_40.success_;
  if (local_40.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_40,
               (AssertionResult *)"Currencies::IsValidCurrency(\"USD\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0x1e,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar2 != false) {
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"JPY","");
    local_40.success_ =
         (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
    local_40.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    bVar2 = local_40.success_;
    if (local_40.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_40,
                 (AssertionResult *)"Currencies::IsValidCurrency(\"JPY\")","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x1f,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar2 != false) {
      local_30._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"EUR","");
      local_40.success_ =
           (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
      local_40.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      bVar2 = local_40.success_;
      if (local_40.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)&local_40,
                   (AssertionResult *)"Currencies::IsValidCurrency(\"EUR\")","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x20,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        if (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_50.ptr_ + 8))();
          }
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (bVar2 != false) {
        local_30._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"GBP","");
        local_40.success_ =
             (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
        local_40.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        bVar2 = local_40.success_;
        if (local_40.success_ == false) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)&local_40,
                     (AssertionResult *)"Currencies::IsValidCurrency(\"GBP\")","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                     ,0x21,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != paVar1) {
            operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
          }
          if (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_50.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_50.ptr_ + 8))();
            }
            local_50.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_40.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (bVar2 != false) {
          local_30._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CHF","");
          local_40.success_ =
               (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
          local_40.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != paVar1) {
            operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
          }
          bVar2 = local_40.success_;
          if (local_40.success_ == false) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,(internal *)&local_40,
                       (AssertionResult *)"Currencies::IsValidCurrency(\"CHF\")","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                       ,0x22,local_30._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_30._M_dataplus._M_p != paVar1) {
              operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
            }
            if (local_50.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) &&
                 (local_50.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_50.ptr_ + 8))();
              }
              local_50.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_40.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (bVar2 != false) {
            local_30._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CAD","");
            local_40.success_ =
                 (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
            local_40.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_30._M_dataplus._M_p != paVar1) {
              operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
            }
            bVar2 = local_40.success_;
            if (local_40.success_ == false) {
              testing::Message::Message((Message *)&local_50);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_30,(internal *)&local_40,
                         (AssertionResult *)"Currencies::IsValidCurrency(\"CAD\")","false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                         ,0x23,local_30._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_30._M_dataplus._M_p != paVar1) {
                operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1
                               );
              }
              testing::Message::~Message((Message *)&local_50);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_40.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (bVar2 != false) {
              local_30._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"AUD","");
              local_40.success_ =
                   (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30);
              local_40.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_30._M_dataplus._M_p != paVar1) {
                operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_40.success_ == false) {
                testing::Message::Message((Message *)&local_50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_30,(internal *)&local_40,
                           (AssertionResult *)"Currencies::IsValidCurrency(\"AUD\")","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                           ,0x24,local_30._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_30._M_dataplus._M_p != paVar1) {
                  operator_delete(local_30._M_dataplus._M_p,
                                  local_30.field_2._M_allocated_capacity + 1);
                }
                testing::Message::~Message((Message *)&local_50);
                testing::AssertionResult::~AssertionResult(&local_40);
              }
              else {
                testing::AssertionResult::~AssertionResult(&local_40);
                local_30._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NZD","");
                local_40.success_ =
                     (bool)bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_30)
                ;
                local_40.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_30._M_dataplus._M_p != paVar1) {
                  operator_delete(local_30._M_dataplus._M_p,
                                  local_30.field_2._M_allocated_capacity + 1);
                }
                if (local_40.success_ == false) {
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,(internal *)&local_40,
                             (AssertionResult *)"Currencies::IsValidCurrency(\"NZD\")","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_48,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                             ,0x25,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                  testing::internal::AssertHelper::~AssertHelper(&local_48);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_30._M_dataplus._M_p != paVar1) {
                    operator_delete(local_30._M_dataplus._M_p,
                                    local_30.field_2._M_allocated_capacity + 1);
                  }
                  testing::Message::~Message((Message *)&local_50);
                  testing::AssertionResult::~AssertionResult(&local_40);
                }
                else {
                  testing::AssertionResult::~AssertionResult(&local_40);
                  local_30._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NOK","");
                  local_40.success_ =
                       (bool)bidfx_public_api::price::Currencies::IsValidCurrency
                                       ((string *)&local_30);
                  local_40.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_30._M_dataplus._M_p != paVar1) {
                    operator_delete(local_30._M_dataplus._M_p,
                                    local_30.field_2._M_allocated_capacity + 1);
                  }
                  if (local_40.success_ == false) {
                    testing::Message::Message((Message *)&local_50);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_30,(internal *)&local_40,
                               (AssertionResult *)"Currencies::IsValidCurrency(\"NOK\")","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_48,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                               ,0x26,local_30._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                    testing::internal::AssertHelper::~AssertHelper(&local_48);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_30._M_dataplus._M_p != paVar1) {
                      operator_delete(local_30._M_dataplus._M_p,
                                      local_30.field_2._M_allocated_capacity + 1);
                    }
                    testing::Message::~Message((Message *)&local_50);
                    testing::AssertionResult::~AssertionResult(&local_40);
                  }
                  else {
                    testing::AssertionResult::~AssertionResult(&local_40);
                    local_30._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SEK","");
                    local_40.success_ =
                         (bool)bidfx_public_api::price::Currencies::IsValidCurrency
                                         ((string *)&local_30);
                    local_40.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_30._M_dataplus._M_p != paVar1) {
                      operator_delete(local_30._M_dataplus._M_p,
                                      local_30.field_2._M_allocated_capacity + 1);
                    }
                    if (local_40.success_ == false) {
                      testing::Message::Message((Message *)&local_50);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_30,(internal *)&local_40,
                                 (AssertionResult *)"Currencies::IsValidCurrency(\"SEK\")","false",
                                 "true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_48,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                 ,0x27,local_30._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                      testing::internal::AssertHelper::~AssertHelper(&local_48);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_30._M_dataplus._M_p != paVar1) {
                        operator_delete(local_30._M_dataplus._M_p,
                                        local_30.field_2._M_allocated_capacity + 1);
                      }
                      testing::Message::~Message((Message *)&local_50);
                    }
                    testing::AssertionResult::~AssertionResult(&local_40);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(CurrenciesTest, test_empty_string_is_not_valid_currency_pair)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair(""));
}